

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_iterate(roaring_bitmap_t *r,roaring_iterator iterator,void *ptr)

{
  _Bool _Var1;
  int local_34;
  int i;
  roaring_array_t *ra;
  void *ptr_local;
  roaring_iterator iterator_local;
  roaring_bitmap_t *r_local;
  
  local_34 = 0;
  while( true ) {
    if ((r->high_low_container).size <= local_34) {
      return true;
    }
    _Var1 = container_iterate((r->high_low_container).containers[local_34],
                              (r->high_low_container).typecodes[local_34],
                              (uint)(r->high_low_container).keys[local_34] << 0x10,iterator,ptr);
    if (!_Var1) break;
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

bool roaring_iterate(const roaring_bitmap_t *r, roaring_iterator iterator,
                     void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate(ra->containers[i], ra->typecodes[i],
                               ((uint32_t)ra->keys[i]) << 16,
                               iterator, ptr)) {
            return false;
        }
    return true;
}